

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCase::BitsToFloatCase
          (BitsToFloatCase *this,TestContext *testCtx,DataType baseType,ShaderType shaderType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int vecSize;
  DataType basicType;
  char *pcVar3;
  ShaderType in_R8D;
  string local_a0;
  VarType local_80;
  Symbol local_68;
  
  shaderexecutor::(anonymous_namespace)::getCommonFuncCaseName_abi_cxx11_
            (&local_68.name,(_anonymous_namespace_ *)(ulong)baseType,TYPE_FLOAT_VEC2,shaderType,
             in_R8D);
  pcVar3 = "uintBitsToFloat";
  if (baseType - TYPE_INT < 4) {
    pcVar3 = "intBitsToFloat";
  }
  CommonFunctionCase::CommonFunctionCase
            (&this->super_CommonFunctionCase,testCtx,local_68.name._M_dataplus._M_p,pcVar3,
             shaderType);
  paVar1 = &local_68.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  (this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CommonFunctionCase_00d39b58;
  vecSize = glu::getDataTypeScalarSize(baseType);
  basicType = TYPE_FLOAT;
  if (1 < vecSize) {
    basicType = glu::getDataTypeFloatVec(vecSize);
  }
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"in0","");
  glu::VarType::VarType(&local_80,baseType,PRECISION_HIGHP);
  Symbol::Symbol(&local_68,&local_a0,&local_80);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.inputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"out0","");
  glu::VarType::VarType(&local_80,basicType,PRECISION_HIGHP);
  Symbol::Symbol(&local_68,&local_a0,&local_80);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>
            (&(this->super_CommonFunctionCase).m_spec.outputs,&local_68);
  glu::VarType::~VarType(&local_68.varType);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = "out0 = uintBitsToFloat(in0);";
  if (baseType - TYPE_INT < 4) {
    pcVar3 = "out0 = intBitsToFloat(in0);";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CommonFunctionCase).m_spec.source,0,
             (char *)(this->super_CommonFunctionCase).m_spec.source._M_string_length,(ulong)pcVar3);
  return;
}

Assistant:

BitsToFloatCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::ShaderType shaderType)
		: CommonFunctionCase	(testCtx, getCommonFuncCaseName(baseType, glu::PRECISION_HIGHP, shaderType).c_str(), glu::isDataTypeIntOrIVec(baseType) ? "intBitsToFloat" : "uintBitsToFloat", shaderType)
	{
		const bool			inIsSigned	= glu::isDataTypeIntOrIVec(baseType);
		const int			vecSize		= glu::getDataTypeScalarSize(baseType);
		const glu::DataType	floatType	= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;

		m_spec.inputs.push_back(Symbol("in0", glu::VarType(baseType, glu::PRECISION_HIGHP)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(floatType, glu::PRECISION_HIGHP)));
		m_spec.source = inIsSigned ? "out0 = intBitsToFloat(in0);" : "out0 = uintBitsToFloat(in0);";
	}